

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O1

void __thiscall ccs::CcsDomain::CcsDomain(CcsDomain *this,bool logAccesses)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Head_base<0UL,_ccs::DagBuilder_*,_false> this_00;
  _func_int **pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<ccs::CcsTracer> local_38;
  
  this_00._M_head_impl = (DagBuilder *)operator_new(0x28);
  pp_Var1 = (_func_int **)operator_new(0x18);
  pp_Var1[1] = (_func_int *)0x100000001;
  *pp_Var1 = (_func_int *)&PTR___Sp_counted_ptr_inplace_001aa160;
  pp_Var1[2] = (_func_int *)&PTR__CcsLogger_001aa1b0;
  local_38.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  (local_38.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_38.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_38.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001aa200;
  local_38.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_38.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
       1);
  local_38.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__LoggingTracer_001aa250;
  *(_func_int ***)
   &local_38.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = pp_Var1 + 2;
  local_38.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = pp_Var1;
  *(bool *)&local_38.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi[2]._M_use_count = logAccesses;
  DagBuilder::DagBuilder(this_00._M_head_impl,&local_38);
  (this->dag)._M_t.super___uniq_ptr_impl<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>.
  _M_t.super__Tuple_impl<0UL,_ccs::DagBuilder_*,_std::default_delete<ccs::DagBuilder>_>.
  super__Head_base<0UL,_ccs::DagBuilder_*,_false>._M_head_impl = this_00._M_head_impl;
  if (local_38.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

CcsDomain::CcsDomain(bool logAccesses) :
  dag(new DagBuilder(CcsTracer::makeLoggingTracer(
    CcsLogger::makeStdErrLogger(), logAccesses))) {}